

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char **in_RSI;
  int in_EDI;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  bool isok;
  size_t k;
  size_t array_in_bytes;
  int c;
  bool verbose;
  size_t iterations;
  size_t m;
  size_t n;
  undefined1 in_stack_000001ff;
  uint32_t in_stack_00000200;
  uint32_t in_stack_00000204;
  undefined1 in_stack_0000296f;
  uint32_t in_stack_00002970;
  uint32_t in_stack_00002974;
  undefined1 in_stack_00002ace;
  undefined1 in_stack_00002acf;
  pospopcnt_u16_method_type in_stack_00002ad0;
  uint32_t in_stack_00002ad8;
  uint32_t in_stack_00002adc;
  uint32_t in_stack_00002ae0;
  ulong local_40;
  ulong local_28;
  long local_20;
  ulong local_18;
  int local_4;
  
  local_18 = 100000;
  local_20 = 1;
  local_28 = 0;
  bVar1 = false;
  while( true ) {
    iVar3 = getopt(in_EDI,in_RSI,"vhm:n:i:");
    auVar5 = in_ZMM0._0_16_;
    if (iVar3 == -1) break;
    switch(iVar3) {
    case 0x68:
      print_usage((char *)0x15eb1f);
      return 0;
    case 0x69:
      iVar3 = atoi(_optarg);
      local_28 = (ulong)iVar3;
      break;
    default:
      abort();
    case 0x6d:
      local_20 = atoll(_optarg);
      break;
    case 0x6e:
      local_18 = atoll(_optarg);
      break;
    case 0x76:
      bVar1 = true;
    }
  }
  if (0xffffffff < local_18) {
    printf("setting n to %u \n",0xffffffff);
    local_18 = 0xffffffff;
  }
  if (0xffffffff < local_28) {
    printf("setting iterations to %u \n",0xffffffff);
    local_28 = 0xffffffff;
  }
  if (local_28 == 0) {
    if (local_20 * local_18 < 1000000) {
      local_28 = 100;
    }
    else {
      local_28 = 10;
    }
  }
  printf("n = %zu m = %zu \n",local_18,local_20);
  printf("iterations = %zu \n",local_28);
  if (local_18 == 0) {
    printf("n cannot be zero.\n");
    local_4 = 1;
  }
  else {
    uVar4 = local_18 * 2 * local_20;
    if (uVar4 < 0x400) {
      printf("array size: %zu B\n",uVar4);
    }
    else if (uVar4 < 0x100000) {
      auVar5 = vcvtusi2sd_avx512f(auVar5,uVar4);
      printf("array size: %.3f kB\n",auVar5._0_8_ / 1024.0);
    }
    else {
      auVar5 = vcvtusi2sd_avx512f(auVar5,uVar4);
      printf("array size: %.3f MB\n",auVar5._0_8_ / 1048576.0);
    }
    measurepopcnt(in_stack_00002974,in_stack_00002970,(bool)in_stack_0000296f);
    measureoverhead(in_stack_00000204,in_stack_00000200,(bool)in_stack_000001ff);
    for (local_40 = 0; local_40 < 0x26; local_40 = local_40 + 1) {
      printf("%-40s\t",pospopcnt_u16_method_names[local_40]);
      fflush((FILE *)0x0);
      bVar2 = benchmarkMany(in_stack_00002ae0,in_stack_00002adc,in_stack_00002ad8,in_stack_00002ad0,
                            (bool)in_stack_00002acf,(bool)in_stack_00002ace);
      if (!bVar2) {
        printf("Problem detected with %s.\n",pospopcnt_u16_method_names[local_40]);
      }
      if (bVar1) {
        printf("\n");
      }
    }
    if (!bVar1) {
      printf("Try -v to get more details.\n");
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    size_t n = 100000;
    size_t m = 1;
    size_t iterations = 0; 
    bool verbose = false;
    int c;

    while ((c = getopt(argc, argv, "vhm:n:i:")) != -1) {
        switch (c) {
        case 'n':
            n = atoll(optarg);
            break;
        case 'm':
            m = atoll(optarg);
            break;
        case 'v':
            verbose = true;
            break;
        case 'h':
            print_usage(argv[0]);
            return EXIT_SUCCESS;
        case 'i':
            iterations = atoi(optarg);
            break;
        default:
            abort();
        }
    }

    if(n > UINT32_MAX) {
       printf("setting n to %u \n", UINT32_MAX);
       n = UINT32_MAX;
    }

    if(iterations > UINT32_MAX) {
       printf("setting iterations to %u \n", UINT32_MAX);
       iterations = UINT32_MAX;
    }

    if(iterations == 0) {
      if(m*n < 1000000) iterations = 100;
      else iterations = 10;
    }
    printf("n = %zu m = %zu \n", n, m);
    printf("iterations = %zu \n", iterations);
    if(n == 0) {
       printf("n cannot be zero.\n");
       return EXIT_FAILURE;
    }

    size_t array_in_bytes = sizeof(uint16_t) * n * m;
    if(array_in_bytes < 1024) {
      printf("array size: %zu B\n", array_in_bytes);
    } else if (array_in_bytes < 1024 * 1024) {
      printf("array size: %.3f kB\n", array_in_bytes / 1024.);
    } else {
      printf("array size: %.3f MB\n", array_in_bytes / (1024 * 1024.));
    }

#if POSPOPCNT_SIMD_VERSION >= 5
    measurepopcnt(n*m, iterations, verbose);
#endif
    measureoverhead(n*m, iterations, verbose);
   
    for (size_t k = 0; k < PPOPCNT_NUMBER_METHODS; k++) {
        printf("%-40s\t", pospopcnt_u16_method_names[k]);
        fflush(NULL);
        bool isok = benchmarkMany(n, m, iterations, pospopcnt_u16_methods[k], verbose, true);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[k]);
        }
        if (verbose)
            printf("\n");
    }

    if (!verbose)
        printf("Try -v to get more details.\n");

    return EXIT_SUCCESS;
}